

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_pack_pubxxx_request
                  (uint8_t *buf,size_t bufsz,MQTTControlPacketType control_type,uint16_t packet_id)

{
  ssize_t sVar1;
  ssize_t rv;
  byte local_38;
  mqtt_fixed_header fixed_header;
  uint8_t *start;
  uint16_t packet_id_local;
  MQTTControlPacketType control_type_local;
  size_t bufsz_local;
  uint8_t *buf_local;
  
  if (buf == (uint8_t *)0x0) {
    buf_local = (uint8_t *)0xffffffff80000001;
  }
  else {
    if (control_type == MQTT_CONTROL_PUBREL) {
      local_38 = local_38 & 0xf0 | 2;
    }
    else {
      local_38 = local_38 & 0xf0;
    }
    fixed_header.control_type = MQTT_CONTROL_CONNACK;
    rv._4_4_ = control_type;
    fixed_header._4_8_ = buf;
    buf_local = (uint8_t *)mqtt_pack_fixed_header(buf,bufsz,(mqtt_fixed_header *)((long)&rv + 4));
    if (0 < (long)buf_local) {
      if (bufsz - (long)buf_local < (ulong)fixed_header.control_type) {
        buf_local = (uint8_t *)0x0;
      }
      else {
        sVar1 = __mqtt_pack_uint16(buf_local + (long)buf,packet_id);
        buf_local = buf_local + (long)buf + (sVar1 - fixed_header._4_8_);
      }
    }
  }
  return (ssize_t)buf_local;
}

Assistant:

ssize_t mqtt_pack_pubxxx_request(uint8_t *buf, size_t bufsz, 
                                 enum MQTTControlPacketType control_type,
                                 uint16_t packet_id) 
{
    const uint8_t *const start = buf;
    struct mqtt_fixed_header fixed_header;
    ssize_t rv;
    if (buf == NULL) {
        return MQTT_ERROR_NULLPTR;
    }

    /* pack fixed header */
    fixed_header.control_type = control_type;
    if (control_type == MQTT_CONTROL_PUBREL) {
        fixed_header.control_flags = 0x02;
    } else {
        fixed_header.control_flags = 0;
    }
    fixed_header.remaining_length = 2;
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        return rv;
    }
    buf += rv;
    bufsz -= (size_t)rv;

    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }
    
    buf += __mqtt_pack_uint16(buf, packet_id);

    return buf - start;
}